

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_write.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  in_addr_t iVar3;
  uint uVar4;
  int __fd;
  int iVar5;
  FILE *__stream;
  long lVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  sockaddr_in sin;
  stat fileinfo;
  char mem [1024];
  sockaddr local_4d8;
  stat local_4c8 [8];
  
  iVar3 = 0x100007f;
  if (1 < argc) {
    iVar3 = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    loclfile = argv[4];
  }
  if (5 < argc) {
    scppath = argv[5];
  }
  uVar4 = libssh2_init(0);
  if (uVar4 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar4);
    return 1;
  }
  __stream = fopen(loclfile,"rb");
  if (__stream == (FILE *)0x0) {
    main_cold_7();
    return 1;
  }
  stat(loclfile,local_4c8);
  __fd = socket(2,1,0);
  if (__fd == -1) {
    main_cold_6();
  }
  else {
    local_4d8.sa_family = 2;
    local_4d8.sa_data[0] = '\0';
    local_4d8.sa_data[1] = '\x16';
    local_4d8.sa_data._2_4_ = iVar3;
    iVar5 = connect(__fd,&local_4d8,0x10);
    if (iVar5 == 0) {
      lVar6 = libssh2_session_init_ex(0,0,0,0);
      if (lVar6 != 0) {
        uVar4 = libssh2_session_handshake(lVar6,__fd);
        if (uVar4 == 0) {
          lVar7 = libssh2_hostkey_hash(lVar6,2);
          fwrite("Fingerprint: ",0xd,1,_stderr);
          lVar10 = 0;
          do {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar7 + lVar10));
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x14);
          fputc(10,_stderr);
          pcVar1 = username;
          sVar8 = strlen(username);
          pcVar2 = password;
          sVar9 = strlen(password);
          iVar5 = libssh2_userauth_password_ex
                            (lVar6,pcVar1,sVar8 & 0xffffffff,pcVar2,sVar9 & 0xffffffff,0);
          if (iVar5 == 0) {
            lVar7 = libssh2_scp_send_ex(lVar6,scppath,local_4c8[0].st_mode & 0x1ff,
                                        local_4c8[0].st_size,0,0);
            if (lVar7 == 0) {
              main_cold_4();
            }
            else {
              main_cold_3();
            }
          }
          else {
            main_cold_2();
          }
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar4);
        }
        goto LAB_0010163e;
      }
      main_cold_5();
    }
    else {
      main_cold_1();
    }
  }
  lVar6 = 0;
LAB_0010163e:
  if (lVar6 != 0) {
    libssh2_session_disconnect_ex(lVar6,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar6);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fclose(__stream);
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    FILE *local;
    char mem[1024];
    size_t nread;
    char *ptr;
    struct stat fileinfo;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        scppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    stat(loclfile, &fileinfo);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed!\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed!\n");
            goto shutdown;
        }
    }

    /* Send a file via scp. The mode parameter must only have permissions! */
    channel = libssh2_scp_send(session, scppath, fileinfo.st_mode & 0777,
                               (size_t)fileinfo.st_size);

    if(!channel) {
        char *errmsg;
        int errlen;
        int err;
        err = libssh2_session_last_error(session, &errmsg, &errlen, 0);
        fprintf(stderr, "Unable to open a session: (%d) %s\n", err, errmsg);
        goto shutdown;
    }

    fprintf(stderr, "SCP session waiting to send file\n");
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        do {
            ssize_t nwritten;
            /* write the same data over and over, until error or completion */
            nwritten = libssh2_channel_write(channel, ptr, nread);
            if(nwritten < 0) {
                fprintf(stderr, "ERROR %d\n", (int)nwritten);
                break;
            }
            else {
                /* nwritten indicates how many bytes were written this time */
                ptr += nwritten;
                nread -= nwritten;
            }
        } while(nread);

    } while(1);

    fprintf(stderr, "Sending EOF\n");
    libssh2_channel_send_eof(channel);

    fprintf(stderr, "Waiting for EOF\n");
    libssh2_channel_wait_eof(channel);

    fprintf(stderr, "Waiting for channel to close\n");
    libssh2_channel_wait_closed(channel);

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    if(local)
        fclose(local);

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return 0;
}